

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void __thiscall
Js::SegmentBTreeRoot::Add(SegmentBTreeRoot *this,Recycler *recycler,SparseArraySegmentBase *newSeg)

{
  Recycler *pRVar1;
  SegmentBTree *this_00;
  SparseArraySegmentBase **ptr;
  uint *ptr_00;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if ((this->super_SegmentBTree).segmentCount == 0x27) {
    local_58 = (undefined1  [8])&SegmentBTree::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x28;
    data.count = (size_t)anon_var_dwarf_693dcf2;
    data.filename._0_4_ = 0xbf;
    pRVar1 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
    this_00 = Memory::AllocateArray<Memory::Recycler,Js::SegmentBTree,false>
                        ((Memory *)pRVar1,(Recycler *)Memory::Recycler::AllocZero,0,0x28);
    SegmentBTree::operator=(this_00,&this->super_SegmentBTree);
    (this->super_SegmentBTree).segmentCount = 0;
    local_58 = (undefined1  [8])&SparseArraySegmentBase*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x27;
    data.count = (size_t)anon_var_dwarf_693dcf2;
    data.filename._0_4_ = 0xc5;
    pRVar1 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
    ptr = (SparseArraySegmentBase **)new__<Memory::Recycler>(0x138,pRVar1,0x59dc42);
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase_*>::WriteBarrierSet
              (&(this->super_SegmentBTree).segments,ptr);
    local_58 = (undefined1  [8])&unsigned_int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x27;
    data.count = (size_t)anon_var_dwarf_693dcf2;
    data.filename._0_4_ = 0xc6;
    pRVar1 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
    ptr_00 = (uint *)new__<Memory::Recycler>(0x9c,pRVar1,0x59dc42);
    Memory::WriteBarrierPtr<unsigned_int>::WriteBarrierSet
              ((WriteBarrierPtr<unsigned_int> *)this,ptr_00);
    Memory::WriteBarrierPtr<Js::SegmentBTree>::WriteBarrierSet
              (&(this->super_SegmentBTree).children,this_00);
    SegmentBTree::SplitChild(recycler,&this->super_SegmentBTree,0,this_00);
  }
  SegmentBTree::InsertNonFullNode(recycler,&this->super_SegmentBTree,newSeg);
  return;
}

Assistant:

void SegmentBTreeRoot::Add(Recycler* recycler, SparseArraySegmentBase* newSeg)
    {

        if (IsFullNode())
        {
            SegmentBTree * children = AllocatorNewArrayZ(Recycler, recycler, SegmentBTree, MaxDegree);
            children[0] = *this;

            // Even though the segments point to a GC pointer, the main array should keep a references
            // as well.  So just make it a leaf allocation
            this->segmentCount = 0;
            this->segments = AllocatorNewArrayLeafZ(Recycler, recycler, SparseArraySegmentBase*, MaxKeys);
            this->keys = AllocatorNewArrayLeafZ(Recycler,recycler,uint32,MaxKeys);
            this->children = children;

            // This split is the only way the tree gets deeper
            SplitChild(recycler, this, 0, &children[0]);
        }
        InsertNonFullNode(recycler, this, newSeg);
    }